

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void add_noise_std_observations
               (aom_noise_model_t *noise_model,int c,double *coeffs,uint8_t *data,uint8_t *denoised,
               int w,int h,int stride,int *sub_log2,uint8_t *alt_data,int alt_stride,
               uint8_t *flat_blocks,int block_size,int num_blocks_w,int num_blocks_h)

{
  double dVar1;
  int iVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R9D;
  uint8_t *block_mean_00;
  double dVar3;
  double dVar4;
  double dVar5;
  int in_stack_00000008;
  undefined4 *in_stack_00000018;
  long in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000048;
  double adjusted_strength;
  double uncorr_std;
  double corr;
  double luma_strength;
  double noise_var;
  double block_mean;
  int num_samples_w;
  int num_samples_h;
  int x_o;
  int bx;
  int y_o;
  int by;
  double noise_gain;
  double luma_gain;
  aom_noise_strength_solver_t *noise_strength_luma;
  aom_noise_strength_solver_t *noise_strength_solver;
  int num_coords;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  uint8_t *in_stack_fffffffffffffee8;
  aom_noise_strength_solver_t *in_stack_fffffffffffffef0;
  uint8_t *in_stack_fffffffffffffef8;
  double in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  int block_size_x;
  double in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int local_b4;
  int local_a8;
  int local_64;
  int local_5c;
  
  iVar2 = *(int *)(in_RDI + 0x2b8);
  dVar1 = *(double *)(in_RDI + 0x1c8);
  for (local_5c = 0; local_5c < in_stack_00000048; local_5c = local_5c + 1) {
    for (local_64 = 0; block_size_x = SUB84(in_stack_ffffffffffffff18,0),
        local_64 < in_stack_00000040; local_64 = local_64 + 1) {
      if (*(char *)(in_stack_00000030 + (local_5c * in_stack_00000040 + local_64)) != '\0') {
        if ((in_stack_00000008 >> ((byte)in_stack_00000018[1] & 0x1f)) -
            local_5c * (in_stack_00000038 >> ((byte)in_stack_00000018[1] & 0x1f)) <
            in_stack_00000038 >> ((byte)in_stack_00000018[1] & 0x1f)) {
          local_a8 = (in_stack_00000008 >> ((byte)in_stack_00000018[1] & 0x1f)) -
                     local_5c * (in_stack_00000038 >> ((byte)in_stack_00000018[1] & 0x1f));
        }
        else {
          local_a8 = in_stack_00000038 >> ((byte)in_stack_00000018[1] & 0x1f);
        }
        if ((in_R9D >> ((byte)*in_stack_00000018 & 0x1f)) -
            local_64 * (in_stack_00000038 >> ((byte)*in_stack_00000018 & 0x1f)) <
            in_stack_00000038 >> ((byte)*in_stack_00000018 & 0x1f)) {
          local_b4 = (in_R9D >> ((byte)*in_stack_00000018 & 0x1f)) -
                     local_64 * (in_stack_00000038 >> ((byte)*in_stack_00000018 & 0x1f));
        }
        else {
          local_b4 = in_stack_00000038 >> ((byte)*in_stack_00000018 & 0x1f);
        }
        if (in_stack_00000038 < local_b4 * local_a8) {
          get_block_mean(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                         in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                         in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                         SUB84(in_stack_ffffffffffffff00,0),SUB84(in_stack_ffffffffffffff08,0));
          in_stack_fffffffffffffed8 = in_stack_00000038 >> ((byte)in_stack_00000018[1] & 0x1f);
          in_stack_fffffffffffffee0 = *(int *)(in_RDI + 0xc);
          block_mean_00 =
               (uint8_t *)
               get_noise_var(in_stack_fffffffffffffef8,(uint8_t *)in_stack_fffffffffffffef0,
                             (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                             (int)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                             in_stack_fffffffffffffee0,SUB84(in_stack_ffffffffffffff10,0),
                             block_size_x,in_stack_ffffffffffffff20,
                             in_R9D >> ((byte)*in_stack_00000018 & 0x1f));
          if (in_ESI < 1) {
            dVar3 = 0.0;
            dVar5 = 0.0;
          }
          else {
            in_stack_ffffffffffffff10 = dVar1;
            dVar3 = noise_strength_solver_get_value
                              (in_stack_fffffffffffffef0,(double)in_stack_fffffffffffffee8);
            dVar3 = in_stack_ffffffffffffff10 * dVar3;
            dVar5 = *(double *)(in_RDX + (long)iVar2 * 8);
          }
          in_stack_ffffffffffffff00 = (double)block_mean_00 / 16.0;
          in_stack_fffffffffffffef8 = block_mean_00;
          in_stack_ffffffffffffff08 = dVar5;
          in_stack_ffffffffffffff18 = dVar3;
          dVar4 = pow(dVar5 * dVar3,2.0);
          if (in_stack_ffffffffffffff00 <= (double)in_stack_fffffffffffffef8 - dVar4) {
            dVar5 = pow(dVar5 * dVar3,2.0);
            in_stack_fffffffffffffef0 =
                 (aom_noise_strength_solver_t *)((double)block_mean_00 - dVar5);
          }
          else {
            in_stack_fffffffffffffef0 =
                 (aom_noise_strength_solver_t *)((double)block_mean_00 / 16.0);
            block_mean_00 = in_stack_fffffffffffffee8;
          }
          sqrt((double)in_stack_fffffffffffffef0);
          aom_noise_strength_solver_add_measurement
                    (in_stack_fffffffffffffef0,(double)block_mean_00,
                     (double)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          in_stack_fffffffffffffee8 = block_mean_00;
        }
      }
    }
  }
  return;
}

Assistant:

static void add_noise_std_observations(
    aom_noise_model_t *noise_model, int c, const double *coeffs,
    const uint8_t *const data, const uint8_t *const denoised, int w, int h,
    int stride, int sub_log2[2], const uint8_t *const alt_data, int alt_stride,
    const uint8_t *const flat_blocks, int block_size, int num_blocks_w,
    int num_blocks_h) {
  const int num_coords = noise_model->n;
  aom_noise_strength_solver_t *noise_strength_solver =
      &noise_model->latest_state[c].strength_solver;

  const aom_noise_strength_solver_t *noise_strength_luma =
      &noise_model->latest_state[0].strength_solver;
  const double luma_gain = noise_model->latest_state[0].ar_gain;
  const double noise_gain = noise_model->latest_state[c].ar_gain;
  for (int by = 0; by < num_blocks_h; ++by) {
    const int y_o = by * (block_size >> sub_log2[1]);
    for (int bx = 0; bx < num_blocks_w; ++bx) {
      const int x_o = bx * (block_size >> sub_log2[0]);
      if (!flat_blocks[by * num_blocks_w + bx]) {
        continue;
      }
      const int num_samples_h =
          AOMMIN((h >> sub_log2[1]) - by * (block_size >> sub_log2[1]),
                 block_size >> sub_log2[1]);
      const int num_samples_w =
          AOMMIN((w >> sub_log2[0]) - bx * (block_size >> sub_log2[0]),
                 (block_size >> sub_log2[0]));
      // Make sure that we have a reasonable amount of samples to consider the
      // block
      if (num_samples_w * num_samples_h > block_size) {
        const double block_mean = get_block_mean(
            alt_data ? alt_data : data, w, h, alt_data ? alt_stride : stride,
            x_o << sub_log2[0], y_o << sub_log2[1], block_size,
            noise_model->params.use_highbd);
        const double noise_var = get_noise_var(
            data, denoised, stride, w >> sub_log2[0], h >> sub_log2[1], x_o,
            y_o, block_size >> sub_log2[0], block_size >> sub_log2[1],
            noise_model->params.use_highbd);
        // We want to remove the part of the noise that came from being
        // correlated with luma. Note that the noise solver for luma must
        // have already been run.
        const double luma_strength =
            c > 0 ? luma_gain * noise_strength_solver_get_value(
                                    noise_strength_luma, block_mean)
                  : 0;
        const double corr = c > 0 ? coeffs[num_coords] : 0;
        // Chroma noise:
        //    N(0, noise_var) = N(0, uncorr_var) + corr * N(0, luma_strength^2)
        // The uncorrelated component:
        //   uncorr_var = noise_var - (corr * luma_strength)^2
        // But don't allow fully correlated noise (hence the max), since the
        // synthesis cannot model it.
        const double uncorr_std = sqrt(
            AOMMAX(noise_var / 16, noise_var - pow(corr * luma_strength, 2)));
        // After we've removed correlation with luma, undo the gain that will
        // come from running the IIR filter.
        const double adjusted_strength = uncorr_std / noise_gain;
        aom_noise_strength_solver_add_measurement(
            noise_strength_solver, block_mean, adjusted_strength);
      }
    }
  }
}